

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

Opcode wabt::Opcode::FromCode(uint8_t prefix,uint32_t code)

{
  Enum EVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  uVar2 = 0x1ff;
  if (code < 0x1ff) {
    uVar2 = code;
  }
  uVar2 = (int)CONCAT71(in_register_00000039,prefix) << 9 | uVar2;
  if ((code != 0) && (WabtOpcodeCodeTable[uVar2] == Unreachable)) {
    EVar1 = EncodeInvalidOpcode(uVar2);
    return (Opcode)EVar1;
  }
  return (Opcode)WabtOpcodeCodeTable[uVar2];
}

Assistant:

inline Opcode Opcode::FromCode(uint8_t prefix, uint32_t code) {
  uint32_t prefix_code = PrefixCode(prefix, code);

  if (WABT_LIKELY(prefix_code < WABT_ARRAY_SIZE(WabtOpcodeCodeTable))) {
    uint32_t value = WabtOpcodeCodeTable[prefix_code];
    // The default value in the table is 0. That's a valid value, but only if
    // the code is 0 (for nop).
    if (WABT_LIKELY(value != 0 || code == 0)) {
      return Opcode(static_cast<Enum>(value));
    }
  }

  return Opcode(EncodeInvalidOpcode(prefix_code));
}